

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
EfcFlash::getLockRegions(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EfcFlash *this)

{
  uint uVar1;
  reference rVar2;
  reference local_58;
  reference local_48;
  uint local_38;
  uint32_t local_34;
  uint32_t region;
  uint32_t fsr1;
  uint32_t fsr0;
  allocator<bool> local_1a;
  undefined1 local_19;
  EfcFlash *local_18;
  EfcFlash *this_local;
  vector<bool,_std::allocator<bool>_> *regions;
  
  local_19 = 0;
  uVar1 = (this->super_Flash)._lockRegions;
  local_18 = this;
  this_local = (EfcFlash *)__return_storage_ptr__;
  std::allocator<bool>::allocator(&local_1a);
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,(ulong)uVar1,&local_1a);
  std::allocator<bool>::~allocator(&local_1a);
  region = readFSR0(this);
  if ((this->super_Flash)._planes == 2) {
    local_34 = readFSR1(this);
  }
  else {
    local_34 = 0;
  }
  for (local_38 = 0; local_38 < (this->super_Flash)._lockRegions; local_38 = local_38 + 1) {
    if (((this->super_Flash)._planes == 2) && ((this->super_Flash)._lockRegions >> 1 <= local_38)) {
      uVar1 = local_34 >>
              ((byte)(((char)local_38 - (char)((this->super_Flash)._lockRegions >> 1)) + 0x10) &
              0x1f);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)local_38);
      local_48 = rVar2;
      std::_Bit_reference::operator=(&local_48,(uVar1 & 1) != 0);
    }
    else {
      uVar1 = region >> ((byte)((char)local_38 + 0x10) & 0x1f);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)local_38);
      local_58 = rVar2;
      std::_Bit_reference::operator=(&local_58,(uVar1 & 1) != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
EfcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t fsr0;
    uint32_t fsr1;

    fsr0 = readFSR0();
    if (_planes == 2)
        fsr1 = readFSR1();
    else
        fsr1 = 0;

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
            regions[region] = (fsr1 & (1 << (16 + region - _lockRegions / 2))) != 0;
        else
            regions[region] = (fsr0 & (1 << (16 + region))) != 0;
    }

    return regions;
}